

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

_Bool pick_and_place_monster
                (chunk *c,loc grid,wchar_t depth,_Bool sleep,_Bool group_okay,uint8_t origin)

{
  _Bool _Var1;
  wchar_t wVar2;
  monster_race *race;
  monster_group_info info;
  
  race = get_mon_num(depth,grid.x);
  _Var1 = is_night();
  if (_Var1) {
    wVar2 = level_topography((int)player->place);
    sleep = wVar2 != L'\0' || sleep;
  }
  if (race == (monster_race *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = place_new_monster(c,grid,race,sleep,group_okay,(monster_group_info)ZEXT816(0),origin);
  }
  return _Var1;
}

Assistant:

bool pick_and_place_monster(struct chunk *c, struct loc grid, int depth,
		bool sleep, bool group_okay, uint8_t origin)
{
	/* Pick a monster race, no specified group */
	struct monster_race *race = get_mon_num(depth, c->depth);
	struct monster_group_info info = { 0, 0, 0 };

	/* Enforce sleep at nighttime in the wilderness */
	if (is_night() && (level_topography(player->place) != TOP_TOWN)) {
		sleep = true;
	}

	if (race) {
		return place_new_monster(c, grid, race, sleep, group_okay, info,
								 origin);
	} else {
		return false;
	}
}